

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O0

void __thiscall OnDiskDataset::save(OnDiskDataset *this)

{
  string_view_t fmt;
  bool bVar1;
  reference this_00;
  OnDiskFileIndex *pOVar2;
  string *psVar3;
  long in_RDI;
  OnDiskIndex *name;
  iterator __end1;
  iterator __begin1;
  vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_names;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000290;
  string *in_stack_00000298;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000002a0;
  string *in_stack_000002a8;
  path *in_stack_000002b0;
  _Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_> in_stack_000002c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_ffffffffffffff10;
  value_type *in_stack_ffffffffffffff28;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff30;
  char *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_88;
  char *local_80;
  __normal_iterator<OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_> local_48
  ;
  long local_40;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x172ba9);
  local_40 = in_RDI + 0x100;
  local_48._M_current =
       (OnDiskIndex *)
       std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>::begin
                 ((vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *)in_stack_ffffffffffffff08);
  std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>::end
            ((vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
              ::operator*(&local_48);
    OnDiskIndex::get_fname_abi_cxx11_(this_00);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    __gnu_cxx::
    __normal_iterator<OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>::
    operator++(&local_48);
  }
  pOVar2 = std::optional<OnDiskFileIndex>::operator->((optional<OnDiskFileIndex> *)0x172cbc);
  OnDiskFileIndex::get_files_fname_abi_cxx11_(pOVar2);
  pOVar2 = std::optional<OnDiskFileIndex>::operator->((optional<OnDiskFileIndex> *)0x172cd9);
  psVar3 = OnDiskFileIndex::get_cache_fname_abi_cxx11_(pOVar2);
  std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
  optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  store_dataset(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298,
                (optional<std::basic_string_view<char,_std::char_traits<char>_>_>)in_stack_000002c0,
                in_stack_00000290);
  ::fmt::v6::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)pbStack_88,local_90);
  fmt.size_ = (size_t)psVar3;
  fmt.data_ = local_80;
  spdlog::info<std::__cxx11::string>(fmt,pbStack_88);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x172d6b);
  return;
}

Assistant:

void OnDiskDataset::save() {
    std::set<std::string> index_names;
    for (const auto &name : indices) {
        index_names.insert(name.get_fname());
    }

    store_dataset(db_base, name, index_names, files_index->get_files_fname(),
                  files_index->get_cache_fname(), taints);
    spdlog::info("SAVE: {}", name);
}